

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O2

array<int,_3UL> __thiscall PFData::unflattenIndex(PFData *this,int index)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  array<int,_3UL> aVar5;
  
  uVar2 = 0xffffffffffffffff;
  iVar3 = -1;
  if (-1 < index) {
    iVar1 = this->m_nx;
    iVar4 = this->m_ny * iVar1;
    if (index < this->m_nz * iVar4) {
      uVar2 = (long)index % (long)iVar4;
      uVar2 = (ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff;
      iVar3 = (int)((long)uVar2 % (long)iVar1);
      uVar2 = (long)index / (long)iVar4 & 0xffffffffU | (long)uVar2 / (long)iVar1 << 0x20;
    }
  }
  aVar5._M_elems[2] = iVar3;
  aVar5._M_elems[0] = (int)uVar2;
  aVar5._M_elems[1] = (int)(uVar2 >> 0x20);
  return (array<int,_3UL>)aVar5._M_elems;
}

Assistant:

std::array<int, 3> PFData::unflattenIndex(int index) const{
    if(index >= getNZ() * getNY() * getNX() || index < 0){  //Invalid index, @@TODO assert instead?
        return {-1, -1, -1};
    }

    const int z = index / (getNX() * getNY());
    index -= z * getNX() * getNY();

    const int y = index / getNX();
    index -= y * getNX();

    const int x = index;    //index remainder is x value

    //Sanity check
    assert(z < getNZ() && z >= 0);
    assert(y < getNY() && y >= 0);
    assert(x < getNX() && x >= 0);

    return {z, y, x};
}